

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase334::~TestCase334(TestCase334 *this)

{
  TestCase334 *this_local;
  
  kj::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(Packed, RoundTripEvenSegmentCountLazy) {
  TestMessageBuilder builder(10);
  initTestMessage(builder.initRoot<TestAllTypes>());

  TestPipe pipe(1);
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  PackedMessageReader reader(pipe);
  checkTestMessage(reader.getRoot<TestAllTypes>());
}